

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cc
# Opt level: O0

void sptk::world::anon_unknown_4::FilterForDecimate(double *x,int x_length,int r,double *y)

{
  long in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  double dVar1;
  int i;
  double wt;
  double w [3];
  double b [2];
  double a [3];
  int local_74;
  double local_68;
  double local_60;
  double local_58;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  long local_18;
  int local_c;
  long local_8;
  
  switch(in_EDX) {
  case 2:
    local_38 = 0.04115673456775719;
    local_30 = -0.42599112459189636;
    local_28 = 0.041037215479961225;
    local_48 = 0.16797464681802227;
    local_40 = 0.5039239404540667;
    break;
  case 3:
    local_38 = 0.9503937898323742;
    local_30 = -0.6742914674152679;
    local_28 = 0.15412211621346475;
    local_48 = 0.07122194517117864;
    local_40 = 0.2136658355135359;
    break;
  case 4:
    local_38 = 1.4499664446880227;
    local_30 = -0.9894349708095058;
    local_28 = 0.24578252340690215;
    local_48 = 0.03671075033932261;
    local_40 = 0.11013225101796784;
    break;
  case 5:
    local_38 = 1.7610939654280557;
    local_30 = -1.2554914843859768;
    local_28 = 0.3237186507788215;
    local_48 = 0.021334858522387423;
    local_40 = 0.06400457556716227;
    break;
  case 6:
    local_38 = 1.971535274951214;
    local_30 = -1.4686795689225347;
    local_28 = 0.3893908434965701;
    local_48 = 0.013469181309343825;
    local_40 = 0.040407543928031475;
    break;
  case 7:
    local_38 = 2.1225239019534703;
    local_30 = -1.6395144861046302;
    local_28 = 0.44469707800587366;
    local_48 = 0.009036688268160842;
    local_40 = 0.027110064804482525;
    break;
  case 8:
    local_38 = 2.2357462340187593;
    local_30 = -1.7780899984041358;
    local_28 = 0.4915255536596869;
    local_48 = 0.006352276340711199;
    local_40 = 0.019056829022133598;
    break;
  case 9:
    local_38 = 2.323600349175958;
    local_30 = -1.8921545617463598;
    local_28 = 0.5314892813372907;
    local_48 = 0.004633116404138937;
    local_40 = 0.013899349212416812;
    break;
  case 10:
    local_38 = 2.3936475118069387;
    local_30 = -1.9873904075111861;
    local_28 = 0.5658879979027055;
    local_48 = 0.0034818622251927556;
    local_40 = 0.010445586675578267;
    break;
  case 0xb:
    local_38 = 2.450743295230728;
    local_30 = -2.06794904601978;
    local_28 = 0.595747744383321;
    local_48 = 0.0026822508007163792;
    local_40 = 0.008046752402149138;
    break;
  case 0xc:
    local_38 = 2.4981398605924205;
    local_30 = -2.1368928194784025;
    local_28 = 0.6218751381622148;
    local_48 = 0.0021097275904709;
    local_40 = 0.0063291827714127;
    break;
  default:
    local_38 = 0.0;
    local_30 = 0.0;
    local_28 = 0.0;
    local_48 = 0.0;
    local_40 = 0.0;
  }
  local_18 = in_RCX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(&local_68,0,0x18);
  for (local_74 = 0; local_74 < local_c; local_74 = local_74 + 1) {
    dVar1 = local_28 * local_58 +
            local_30 * local_60 + local_38 * local_68 + *(double *)(local_8 + (long)local_74 * 8);
    *(double *)(local_18 + (long)local_74 * 8) =
         local_48 * local_58 + local_40 * local_60 + local_48 * dVar1 + local_40 * local_68;
    local_58 = local_60;
    local_60 = local_68;
    local_68 = dVar1;
  }
  return;
}

Assistant:

static void FilterForDecimate(const double *x, int x_length, int r, double *y) {
  double a[3], b[2];  // filter Coefficients
  switch (r) {
    case 11:  // fs : 44100 (default)
      a[0] = 2.450743295230728;
      a[1] = -2.06794904601978;
      a[2] = 0.59574774438332101;
      b[0] = 0.0026822508007163792;
      b[1] = 0.0080467524021491377;
      break;
    case 12:  // fs : 48000
      a[0] = 2.4981398605924205;
      a[1] = -2.1368928194784025;
      a[2] = 0.62187513816221485;
      b[0] = 0.0021097275904709001;
      b[1] = 0.0063291827714127002;
      break;
    case 10:
      a[0] = 2.3936475118069387;
      a[1] = -1.9873904075111861;
      a[2] = 0.5658879979027055;
      b[0] = 0.0034818622251927556;
      b[1] = 0.010445586675578267;
      break;
    case 9:
      a[0] = 2.3236003491759578;
      a[1] = -1.8921545617463598;
      a[2] = 0.53148928133729068;
      b[0] = 0.0046331164041389372;
      b[1] = 0.013899349212416812;
      break;
    case 8:  // fs : 32000
      a[0] = 2.2357462340187593;
      a[1] = -1.7780899984041358;
      a[2] = 0.49152555365968692;
      b[0] = 0.0063522763407111993;
      b[1] = 0.019056829022133598;
      break;
    case 7:
      a[0] = 2.1225239019534703;
      a[1] = -1.6395144861046302;
      a[2] = 0.44469707800587366;
      b[0] = 0.0090366882681608418;
      b[1] = 0.027110064804482525;
      break;
    case 6:  // fs : 24000 and 22050
      a[0] = 1.9715352749512141;
      a[1] = -1.4686795689225347;
      a[2] = 0.3893908434965701;
      b[0] = 0.013469181309343825;
      b[1] = 0.040407543928031475;
      break;
    case 5:
      a[0] = 1.7610939654280557;
      a[1] = -1.2554914843859768;
      a[2] = 0.3237186507788215;
      b[0] = 0.021334858522387423;
      b[1] = 0.06400457556716227;
      break;
    case 4:  // fs : 16000
      a[0] = 1.4499664446880227;
      a[1] = -0.98943497080950582;
      a[2] = 0.24578252340690215;
      b[0] = 0.036710750339322612;
      b[1] = 0.11013225101796784;
      break;
    case 3:
      a[0] = 0.95039378983237421;
      a[1] = -0.67429146741526791;
      a[2] = 0.15412211621346475;
      b[0] = 0.071221945171178636;
      b[1] = 0.21366583551353591;
      break;
    case 2:  // fs : 8000
      a[0] = 0.041156734567757189;
      a[1] = -0.42599112459189636;
      a[2] = 0.041037215479961225;
      b[0] = 0.16797464681802227;
      b[1] = 0.50392394045406674;
      break;
    default:
      a[0] = 0.0;
      a[1] = 0.0;
      a[2] = 0.0;
      b[0] = 0.0;
      b[1] = 0.0;
  }

  // Filtering on time domain.
  double w[3] = {0.0, 0.0, 0.0};
  double wt;
  for (int i = 0; i < x_length; ++i) {
    wt = x[i] + a[0] * w[0] + a[1] * w[1] + a[2] * w[2];
    y[i] = b[0] * wt + b[1] * w[0] + b[1] * w[1] + b[0] * w[2];
    w[2] = w[1];
    w[1] = w[0];
    w[0] = wt;
  }
}